

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O1

LY_ERR lyd_parse_json(ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,
                     ly_in *in,uint32_t parse_opts,uint32_t val_opts,uint32_t int_opts,
                     ly_set *parsed,ly_bool *subtree_sibling,lyd_ctx **lydctx_p)

{
  lyd_json_ctx *lydctx_00;
  LY_ERR LVar1;
  LYJSON_PARSER_STATUS LVar2;
  ly_err_item *plVar3;
  lyd_node **first_p_00;
  LY_ERR LVar4;
  lyd_json_ctx *lydctx;
  lyd_json_ctx *local_48;
  ly_ctx *local_40;
  lyd_node **local_38;
  
  local_48 = (lyd_json_ctx *)0x0;
  LVar1 = lyd_parse_json_init(ctx,in,parse_opts,val_opts,&local_48);
  if (LVar1 == LY_SUCCESS) {
    local_48->int_opts = int_opts;
    local_48->ext = ext;
    local_38 = first_p;
    LVar1 = lyd_parser_find_operation(parent,int_opts,&local_48->op_node);
    if (LVar1 == LY_SUCCESS) {
      LVar4 = LY_SUCCESS;
      local_40 = ctx;
      do {
        LVar1 = lydjson_subtree_r(local_48,parent,local_38,parsed);
        if ((LVar1 != LY_SUCCESS) &&
           ((((plVar3 = ly_err_last(local_48->jsonctx->ctx), LVar1 != LY_EVALID ||
              (local_48 == (lyd_json_ctx *)0x0)) || ((local_48->val_opts & 4) == 0)) ||
            (LVar4 = LVar1, plVar3->vecode == LYVE_SYNTAX)))) goto LAB_00134631;
        LVar2 = lyjson_ctx_status(local_48->jsonctx);
      } while (((int_opts & 0x20) != 0) && (LVar2 == LYJSON_OBJECT_NEXT));
      if (((int_opts & 0x40) != 0) &&
         ((*local_48->jsonctx->in->current != '\0' && (LVar2 != LYJSON_OBJECT_CLOSED)))) {
        ly_vlog(local_40,(char *)0x0,LYVE_SYNTAX,"Unexpected sibling node.");
        plVar3 = ly_err_last(local_48->jsonctx->ctx);
        LVar1 = LY_EVALID;
        if ((local_48 == (lyd_json_ctx *)0x0) ||
           (((local_48->val_opts & 4) == 0 || (LVar4 = LY_EVALID, plVar3->vecode == LYVE_SYNTAX))))
        goto LAB_00134631;
      }
      if (((int_opts & 0xf) != 0) && (local_48->op_node == (lyd_node *)0x0)) {
        ly_vlog(local_40,(char *)0x0,LYVE_DATA,"Missing the operation node.");
        plVar3 = ly_err_last(local_48->jsonctx->ctx);
        LVar1 = LY_EVALID;
        if (((local_48 == (lyd_json_ctx *)0x0) || ((local_48->val_opts & 4) == 0)) ||
           (LVar4 = LY_EVALID, plVar3->vecode == LYVE_SYNTAX)) goto LAB_00134631;
      }
      lydctx_00 = local_48;
      first_p_00 = local_38;
      if (parent != (lyd_node *)0x0) {
        first_p_00 = lyd_node_child_p(parent);
      }
      LVar1 = lydjson_metadata_finish(lydctx_00,first_p_00);
      if ((LVar1 == LY_SUCCESS) && (LVar1 = LVar4, (parse_opts >> 0x16 & 1) != 0)) {
        if (subtree_sibling == (ly_bool *)0x0) {
          __assert_fail("subtree_sibling",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                        ,0x773,
                        "LY_ERR lyd_parse_json(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                       );
        }
        if (LVar2 == LYJSON_OBJECT_NEXT) {
          *subtree_sibling = '\x01';
          ly_in_skip(local_48->jsonctx->in,1);
        }
        else {
          *subtree_sibling = '\0';
        }
      }
    }
  }
LAB_00134631:
  if (((local_48 != (lyd_json_ctx *)0x0 & (byte)(parse_opts >> 0x10)) == 1) &&
     ((((local_48->node_types).count != 0 || ((local_48->meta_types).count != 0)) ||
      ((local_48->node_when).count != 0)))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count && !lydctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x781,
                  "LY_ERR lyd_parse_json(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, uint32_t, struct ly_set *, ly_bool *, struct lyd_ctx **)"
                 );
  }
  if ((LVar1 == LY_SUCCESS) ||
     (((local_48 != (lyd_json_ctx *)0x0 && ((local_48->val_opts & 4) != 0)) && (LVar1 == LY_EVALID))
     )) {
    *lydctx_p = (lyd_ctx *)local_48;
    lyjson_ctx_free(local_48->jsonctx);
    local_48->jsonctx = (lyjson_ctx *)0x0;
  }
  else {
    lyd_json_ctx_free((lyd_ctx *)local_48);
  }
  return LVar1;
}

Assistant:

LY_ERR
lyd_parse_json(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, uint32_t int_opts,
        struct ly_set *parsed, ly_bool *subtree_sibling, struct lyd_ctx **lydctx_p)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_json_ctx *lydctx = NULL;
    enum LYJSON_PARSER_STATUS status;

    rc = lyd_parse_json_init(ctx, in, parse_opts, val_opts, &lydctx);
    LY_CHECK_GOTO(rc, cleanup);

    lydctx->int_opts = int_opts;
    lydctx->ext = ext;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lydctx->op_node), cleanup);

    /* read subtree(s) */
    do {
        r = lydjson_subtree_r(lydctx, parent, first_p, parsed);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

        status = lyjson_ctx_status(lydctx->jsonctx);

        if (!(int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    } while (status == LYJSON_OBJECT_NEXT);

    if ((int_opts & LYD_INTOPT_NO_SIBLINGS) && lydctx->jsonctx->in->current[0] && (status != LYJSON_OBJECT_CLOSED)) {
        LOGVAL(ctx, LYVE_SYNTAX, "Unexpected sibling node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }
    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lydctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }

    /* finish linking metadata */
    r = lydjson_metadata_finish(lydctx, parent ? lyd_node_child_p(parent) : first_p);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

    if (parse_opts & LYD_PARSE_SUBTREE) {
        /* check for a sibling object */
        assert(subtree_sibling);
        if (status == LYJSON_OBJECT_NEXT) {
            *subtree_sibling = 1;

            /* move to the next object */
            ly_in_skip(lydctx->jsonctx->in, 1);
        } else {
            *subtree_sibling = 0;
        }
    }

cleanup:
    /* there should be no unresolved types stored */
    assert(!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count &&
            !lydctx->node_when.count));

    if (rc && (!lydctx || !(lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) || (rc != LY_EVALID))) {
        lyd_json_ctx_free((struct lyd_ctx *)lydctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lydctx;

        /* the JSON context is no more needed, freeing it also stops logging line numbers which would be confusing now */
        lyjson_ctx_free(lydctx->jsonctx);
        lydctx->jsonctx = NULL;
    }
    return rc;
}